

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall Interpreter::InterpretLine(Interpreter *this,string *line)

{
  pointer pbVar1;
  unsigned_long extraout_RDX;
  pointer pbVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  Word tokword;
  is_any_ofF<char> local_68;
  string local_50 [32];
  
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boost::algorithm::is_any_of<char[2]>(&local_68,(char (*) [2])0x106161);
  boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
            (&tokens,line,&local_68,token_compress_off);
  boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_68);
  pbVar1 = tokens.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = tokens.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    std::__cxx11::string::string(local_50,(string *)pbVar2);
    tokword.major = huelang::DefinitionTable::TokToWord(this,local_50);
    tokword.minor = extraout_RDX;
    std::__cxx11::string::~string(local_50);
    std::deque<huelang::Word,_std::allocator<huelang::Word>_>::push_back
              ((deque<huelang::Word,_std::allocator<huelang::Word>_> *)&(this->env).executionStack,
               &tokword);
    huelang::Environment::Run();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&tokens);
  return;
}

Assistant:

void Interpreter::InterpretLine (string line) {
    vector<string> tokens;
    split(tokens, line, is_any_of(" "));
    
    for (string& tok: tokens) {
        Word tokword = env.definitionTable.TokToWord(tok);
        env.executionStack.push(tokword);
        env.Run();
    }
}